

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

void __thiscall
CTcHashEntryPpDefine::CTcHashEntryPpDefine
          (CTcHashEntryPpDefine *this,textchar_t *str,size_t len,int copy,int has_args,int argc,
          int has_varargs,char **argv,size_t *argvlen,char *expansion,size_t expan_len)

{
  char **ppcVar1;
  CVmHashTable *this_00;
  CVmHashFunc *hash_function;
  CTcHashEntryPpArg **ppCVar2;
  char *pcVar3;
  CVmHashEntry *entry;
  ulong uVar4;
  ulong uVar5;
  
  CTcHashEntryPp::CTcHashEntryPp(&this->super_CTcHashEntryPp,str,len,copy);
  (this->super_CTcHashEntryPp).super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry =
       (_func_int **)&PTR__CTcHashEntryPpDefine_00316810;
  (this->super_CTcHashEntryPp).field_0x44 =
       (char)has_varargs * '\x02' & 2U | (byte)has_args & 1 |
       (this->super_CTcHashEntryPp).field_0x44 & 0xfc;
  (this->super_CTcHashEntryPp).argc_ = argc;
  if (argc == 0) {
    (this->super_CTcHashEntryPp).argv_ = (char **)0x0;
    (this->super_CTcHashEntryPp).arg_entry_ = (CTcHashEntryPpArg **)0x0;
    (this->super_CTcHashEntryPp).params_table_ = (CVmHashTable *)0x0;
  }
  else {
    ppcVar1 = (char **)malloc((long)argc << 3);
    (this->super_CTcHashEntryPp).argv_ = ppcVar1;
    this_00 = (CVmHashTable *)operator_new(0x20);
    hash_function = (CVmHashFunc *)operator_new(8);
    hash_function->_vptr_CVmHashFunc = (_func_int **)&PTR__CVmHashFunc_0031c898;
    CVmHashTable::CVmHashTable(this_00,0x10,hash_function,1);
    (this->super_CTcHashEntryPp).params_table_ = this_00;
    ppCVar2 = (CTcHashEntryPpArg **)malloc((long)argc << 3);
    (this->super_CTcHashEntryPp).arg_entry_ = ppCVar2;
    uVar4 = 0;
    uVar5 = (ulong)(uint)argc;
    if (argc < 1) {
      uVar5 = uVar4;
    }
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      pcVar3 = lib_copy_str(argv[uVar4],argvlen[uVar4]);
      (this->super_CTcHashEntryPp).argv_[uVar4] = pcVar3;
      entry = (CVmHashEntry *)operator_new(0x28);
      CTcHashEntryPpArg::CTcHashEntryPpArg
                ((CTcHashEntryPpArg *)entry,(this->super_CTcHashEntryPp).argv_[uVar4],argvlen[uVar4]
                 ,0,(int)uVar4);
      CVmHashTable::add((this->super_CTcHashEntryPp).params_table_,entry);
      (this->super_CTcHashEntryPp).arg_entry_[uVar4] = (CTcHashEntryPpArg *)entry;
    }
  }
  pcVar3 = lib_copy_str(expansion,expan_len);
  this->orig_expan_ = pcVar3;
  this->orig_expan_len_ = expan_len;
  parse_expansion(this,argvlen);
  return;
}

Assistant:

CTcHashEntryPpDefine::CTcHashEntryPpDefine(const textchar_t *str, size_t len,
                                           int copy, int has_args, int argc,
                                           int has_varargs,
                                           const char **argv,
                                           const size_t *argvlen,
                                           const char *expansion,
                                           size_t expan_len)
    : CTcHashEntryPp(str, len, copy)
{
    /* copy the argument list if necessary */
    has_args_ = has_args;
    has_varargs_ = has_varargs;
    argc_ = argc;
    if (argc != 0)
    {
        int i;
        
        /* allocate the argument list */
        argv_ = (char **)t3malloc(argc * sizeof(*argv_));

        /* allocate the parameters hash table */
        params_table_ = new CVmHashTable(16, new CVmHashFuncCS(), TRUE);

        /* allocate the entry list */
        arg_entry_ = (CTcHashEntryPpArg **)
                     t3malloc(argc * sizeof(arg_entry_[0]));

        /* copy the arguments */
        for (i = 0 ; i < argc ; ++i)
        {
            CTcHashEntryPpArg *entry;
            
            /* copy the argument name */
            argv_[i] = lib_copy_str(argv[i], argvlen[i]);

            /* 
             *   Create the hash entries for this parameters.  We'll use
             *   this entry to look up tokens in the expansion text for
             *   matches to the formal names when expanding the macro.
             *   
             *   Note that we'll refer directly to our local copy of the
             *   argument name, so we don't need to make another copy in
             *   the hash entry.  
             */
            entry = new CTcHashEntryPpArg(argv_[i], argvlen[i], FALSE, i);
            params_table_->add(entry);

            /* add it to our by-index list */
            arg_entry_[i] = entry;
        }
    }
    else
    {
        /* no arguments */
        argv_ = 0;
        params_table_ = 0;
        arg_entry_ = 0;
    }

    /* save the original version of the expansion */
    orig_expan_ = lib_copy_str(expansion, expan_len);
    orig_expan_len_ = expan_len;

    /* parse the expansion, and save the parsed result */
    parse_expansion(argvlen);
}